

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitem.cpp
# Opt level: O2

void depspawn::internal::Workitem::Clean_worklist(Workitem *worklist_wait_hint)

{
  int iVar1;
  Workitem *pWVar2;
  int i;
  long lVar3;
  uint uVar4;
  Workitem *pWVar5;
  int i_1;
  ulong uVar6;
  Workitem *local_40;
  Workitem *last_workitem;
  
  if ((Clean_worklist(depspawn::internal::Workitem*)::Dones == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Clean_worklist(depspawn::internal::Workitem*)::Dones), iVar1 != 0
     )) {
    Clean_worklist::Dones.
    super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Clean_worklist::Dones.
    super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Clean_worklist::Dones.
    super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(std::
                 vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                 ::~vector,&Clean_worklist::Dones,&__dso_handle);
    __cxa_guard_release(&Clean_worklist(depspawn::internal::Workitem*)::Dones);
  }
  if ((Clean_worklist(depspawn::internal::Workitem*)::Deletable_Sublists == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Clean_worklist(depspawn::internal::Workitem*)::Deletable_Sublists
                                 ), iVar1 != 0)) {
    Clean_worklist::Deletable_Sublists.
    super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    Clean_worklist::Deletable_Sublists.
    super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    Clean_worklist::Deletable_Sublists.
    super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __cxa_atexit(std::
                 vector<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
                 ::~vector,&Clean_worklist::Deletable_Sublists,&__dso_handle);
    __cxa_guard_release(&Clean_worklist(depspawn::internal::Workitem*)::Deletable_Sublists);
  }
  uVar4 = 0;
  local_40 = (anonymous_namespace)::worklist;
  pWVar5 = (anonymous_namespace)::worklist;
  while (local_40 = local_40->next, local_40 != (Workitem *)0x0) {
    if (local_40->status == Deallocatable) {
      uVar4 = uVar4 + 1;
      last_workitem = local_40;
    }
    else {
      if (local_40->status == Done) {
        std::vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
        ::push_back(&Clean_worklist::Dones,&local_40);
      }
      if (4 < uVar4) {
        std::
        vector<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>,std::allocator<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>>>
        ::emplace_back<depspawn::internal::Workitem*&,depspawn::internal::Workitem*&>
                  ((vector<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>,std::allocator<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>>>
                    *)&Clean_worklist::Deletable_Sublists,&pWVar5->next,&last_workitem);
        pWVar5->next = local_40;
      }
      uVar4 = 0;
      pWVar5 = local_40;
      last_workitem = local_40;
    }
  }
  pWVar2 = (anonymous_namespace)::worklist;
  if (pWVar5->next != (Workitem *)0x0) {
    std::
    vector<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>,std::allocator<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>>>
    ::emplace_back<depspawn::internal::Workitem*&,depspawn::internal::Workitem*&>
              ((vector<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>,std::allocator<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>>>
                *)&Clean_worklist::Deletable_Sublists,&pWVar5->next,&last_workitem);
    pWVar5->next = (Workitem *)0x0;
    pWVar2 = (anonymous_namespace)::worklist;
  }
  for (; pWVar2 != worklist_wait_hint; pWVar2 = pWVar2->next) {
    do {
    } while (pWVar2->status == Filling);
    if ((pWVar2->optFlags_ & 3) == 0) break;
  }
  for (lVar3 = 0;
      lVar3 != (long)Clean_worklist::Dones.
                     super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)Clean_worklist::Dones.
                     super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3; lVar3 = lVar3 + 1) {
    do {
    } while (Clean_worklist::Dones.
             super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar3]->status == Done);
  }
  if (Clean_worklist::Dones.
      super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      Clean_worklist::Dones.
      super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    Clean_worklist::Dones.
    super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         Clean_worklist::Dones.
         super__Vector_base<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  lVar3 = 8;
  local_40 = pWVar2;
  for (uVar6 = 0;
      uVar6 < (ulong)((long)Clean_worklist::Deletable_Sublists.
                            super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)Clean_worklist::Deletable_Sublists.
                            super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar6 = uVar6 + 1) {
    LinkedListPool<depspawn::internal::Workitem,_true,_false>::freeLinkedList
              ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)Pool,
               *(Workitem **)
                ((long)Clean_worklist::Deletable_Sublists.
                       super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar3 + -8),
               *(Workitem **)
                ((long)&(Clean_worklist::Deletable_Sublists.
                         super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first + lVar3),false);
    lVar3 = lVar3 + 0x10;
  }
  if (Clean_worklist::Deletable_Sublists.
      super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      Clean_worklist::Deletable_Sublists.
      super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    Clean_worklist::Deletable_Sublists.
    super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         Clean_worklist::Deletable_Sublists.
         super__Vector_base<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  LOCK();
  (anonymous_namespace)::eraser_assigned = 0;
  UNLOCK();
  return;
}

Assistant:

void Workitem::Clean_worklist(Workitem *worklist_wait_hint)
    { static std::vector<Workitem *> Dones;
      static std::vector< std::pair<Workitem *, Workitem *> > Deletable_Sublists;

      DEPSPAWN_PROFILEDEFINITION(const auto t0 = std::chrono::high_resolution_clock::now());
      //DEPSPAWN_PROFILEDEFINITION(unsigned int profile_deleted_workitems = 0);
      DEPSPAWN_PROFILEACTION(profile_erases++);

      Workitem *lastkeep = worklist.load();
      Workitem *last_workitem, *p;
      
      unsigned int deletable_workitems = 0;

      for(p = lastkeep->next; p != nullptr; p = p->next) {
        
        if( p->status != Status_t::Deallocatable ) {
          
          if(p->status == Status_t::Done) {
            Dones.push_back(p);
          }
          
          if (deletable_workitems > 4) { //We ask for a minimum that justifies the cost
            Deletable_Sublists.emplace_back(lastkeep->next, last_workitem); // Deleted sublist
            lastkeep->next = p;
            //DEPSPAWN_PROFILEACTION(profile_deleted_workitems += deletable_workitems);
          }
          
          lastkeep = p;
          deletable_workitems = 0;
          
        } else {
          deletable_workitems++;
        }
        
        last_workitem = p;
      }

      if (lastkeep->next != nullptr) {
        Deletable_Sublists.emplace_back(lastkeep->next, last_workitem);
        lastkeep->next = nullptr;
        //DEPSPAWN_PROFILEACTION(profile_deleted_workitems += deletable_workitems);
      }

      std::atomic_thread_fence(std::memory_order_seq_cst);

      //DEPSPAWN_PROFILEACTION(printf("D %u (%u) (%u) %c\n", profile_deleted_workitems, (unsigned)Dones.size(), (unsigned)Deletable_Sublists.size(), ));

      p = worklist.load(std::memory_order_seq_cst);
#ifdef __arm64__
        // Make sure changes are seen in insert_in_worklist upon insertion in worklist
        // See semantics of std::atomic_thread_fence
        while(!worklist.compare_exchange_weak(p, p));
#endif

      for( ; p != worklist_wait_hint; p = p->next) {
        
        while(p->status == Status_t::Filling) { } // Waits until work p has its dependencies
        
        if(! (p->optFlags_ & (OptFlags::PendingFills|OptFlags::FatherScape)) ) {
          break;
        }
        
      }

      for (int i = 0; i < Dones.size(); i++) {
        while (Dones[i]->status == Status_t::Done) { }
      }
      Dones.clear(); //Needed because it is static!

      for (int i = 0; i < Deletable_Sublists.size(); i++) {
        Workitem * const begin = Deletable_Sublists[i].first;
        Workitem * const end = Deletable_Sublists[i].second;
        DEPSPAWN_DEBUGACTION(
                             for(Workitem *q = begin;  q != end->next; q = q->next) {
                               assert(q->args == nullptr);
                               assert(q->status == Status_t::Deallocatable);
                               if (q->deps) {
                                 printf("%p -> %p\n", q, q->deps);
                                 assert(q->deps == nullptr);
                               }
                             }
                             ); // END DEPSPAWN_DEBUGACTION
        
        Workitem::Pool.freeLinkedList(begin, end);
      }
      Deletable_Sublists.clear(); //Needed because it is static!
      
      DEPSPAWN_PROFILEACTION(profile_time_eraser_waiting += std::chrono::duration <double>(std::chrono::high_resolution_clock::now() - t0).count());
      
      /*
       for(p = next; p; p = p->next) {
         last_workitem = p;
         if( p->status != Status_t::Deallocatable )
         lastkeep = p;
       }
       
       Workitem *dp = lastkeep->next; // Everything from here will be deleted
       lastkeep->next = nullptr;
       
       if (dp != nullptr) {
       
         for(p = worklist; p != worklist_wait_hint; p = p->next) {
           while(p->status == Status_t::Filling) { } // Waits until work p has its dependencies
           if(! (p->optFlags_ & (OptFlags::PendingFills|OptFlags::FatherScape)) ) {
             break;
           }
         }
       
         DEPSPAWN_PROFILEACTION(profile_time_eraser_waiting += std::chrono::duration <double>(std::chrono::high_resolution_clock::now() - t0).count());
       
         DEPSPAWN_DEBUGACTION(
           for(p = dp; p; p = p->next) {
             assert(p-> args == nullptr);
             if (p->deps) {
               printf("%p -> %p\n", p, p->deps);
               assert(p->deps == nullptr);
             }
           }
         ); // END DEPSPAWN_DEBUGACTION
       
         Workitem::Pool.freeLinkedList(dp, last_workitem);
       }
       */
      
      eraser_assigned = false;
    }